

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

hittable_list * final_scene(void)

{
  vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_> *pvVar1;
  _func_int **pp_Var2;
  pointer psVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  int iVar4;
  int iVar5;
  int iVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  hittable_list *in_RDI;
  int iVar8;
  vec3 local_288;
  hittable_list boxes2;
  shared_ptr<lambertian> emat;
  shared_ptr<sphere> boundary;
  sphere *local_220;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_218;
  undefined1 local_209;
  vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_> *local_208;
  shared_ptr<noise_texture> pertext;
  shared_ptr<lambertian> white;
  shared_ptr<rotate_y> local_1e0;
  vec3 center2;
  vec3 center1;
  int ny;
  int nx;
  shared_ptr<bvh_node> local_178;
  value_type local_168;
  shared_ptr<lambertian> moving_sphere_material;
  shared_ptr<lambertian> ground;
  value_type local_138;
  shared_ptr<diffuse_light> light;
  value_type local_118;
  int local_108;
  int nn;
  hittable_list boxes1;
  value_type local_e0;
  value_type local_d0;
  value_type local_c0;
  value_type local_b0;
  value_type local_a0;
  value_type local_90;
  value_type local_80;
  value_type local_70;
  value_type local_60;
  value_type local_50;
  double local_40;
  double local_38;
  
  boxes1.super_hittable._vptr_hittable = (_func_int **)&PTR_hit_0012e0b8;
  boxes1.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  boxes1.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  boxes1.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  boxes2.super_hittable._vptr_hittable = (_func_int **)0x0;
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)operator_new(0x30);
  ((boxes2.objects.
    super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
    _M_impl.super__Vector_impl_data._M_start)->
  super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x100000001;
  ((boxes2.objects.
    super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
    _M_impl.super__Vector_impl_data._M_start)->
  super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)&PTR___Sp_counted_ptr_inplace_0012e630;
  boxes2.super_hittable._vptr_hittable =
       (_func_int **)
       (boxes2.objects.
        super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
        _M_impl.super__Vector_impl_data._M_start + 1);
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start[1].super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3fdeb851eb851eb8;
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start[2].super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x3fea8f5c28f5c28f;
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start[2].super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3fe0f5c28f5c28f6;
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start[1].super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)&PTR_value_0012e680;
  ground.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<lambertian,std::allocator<lambertian>,std::shared_ptr<constant_texture>>
            (&ground.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (lambertian **)&ground,(allocator<lambertian> *)&center1,
             (shared_ptr<constant_texture> *)&boxes2);
  if (boxes2.objects.
      super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               boxes2.objects.
               super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
  }
  iVar5 = 0;
  do {
    pp_Var2 = (_func_int **)((double)iVar5 * 100.0 + -1000.0);
    local_208 = (vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_> *)
                ((double)pp_Var2 + 100.0);
    iVar8 = 0;
    do {
      psVar3 = (pointer)((double)iVar8 * 100.0 + -1000.0);
      iVar4 = rand();
      center1.e[1] = (double)iVar4 * 4.656612873077393e-10 * 100.0 + 1.0;
      boxes2.objects.
      super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      center1.e[2] = (double)psVar3 + 100.0;
      center1.e[0] = (double)local_208;
      center2.e[0] = 0.0;
      boxes2.super_hittable._vptr_hittable = pp_Var2;
      boxes2.objects.
      super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = psVar3;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<box,std::allocator<box>,vec3,vec3,std::shared_ptr<lambertian>&>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(center2.e + 1),(box **)&center2,
                 (allocator<box> *)&local_288,(vec3 *)&boxes2,&center1,&ground);
      local_118.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)center2.e[0];
      local_118.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)center2.e[1];
      center2.e[0] = 0.0;
      center2.e[1] = 0.0;
      std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
                (&boxes1.objects,&local_118);
      if (local_118.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_118.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (center2.e[1] != 0.0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)center2.e[1]);
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 != 0x14);
    iVar5 = iVar5 + 1;
  } while (iVar5 != 0x14);
  (in_RDI->super_hittable)._vptr_hittable = (_func_int **)&PTR_hit_0012e0b8;
  pvVar1 = &in_RDI->objects;
  (in_RDI->objects).
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->objects).
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (in_RDI->objects).
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  center1.e[0] = (double)((ulong)center1.e[0] & 0xffffffff00000000);
  center2.e[0] = (double)CONCAT44(center2.e[0]._4_4_,1);
  boxes2.super_hittable._vptr_hittable = (_func_int **)0x0;
  local_208 = pvVar1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<bvh_node,std::allocator<bvh_node>,hittable_list&,int,int>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&boxes2.objects,(bvh_node **)&boxes2,
             (allocator<bvh_node> *)&local_288,&boxes1,(int *)&center1,(int *)&center2);
  local_50.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)boxes2.super_hittable._vptr_hittable;
  local_50.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       boxes2.objects.
       super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  boxes2.super_hittable._vptr_hittable = (_func_int **)0x0;
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (pvVar1,&local_50);
  if (local_50.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (boxes2.objects.
      super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               boxes2.objects.
               super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
  }
  boxes2.super_hittable._vptr_hittable = (_func_int **)0x0;
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)operator_new(0x30);
  ((boxes2.objects.
    super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
    _M_impl.super__Vector_impl_data._M_start)->
  super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x100000001;
  ((boxes2.objects.
    super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
    _M_impl.super__Vector_impl_data._M_start)->
  super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)&PTR___Sp_counted_ptr_inplace_0012e630;
  boxes2.super_hittable._vptr_hittable =
       (_func_int **)
       (boxes2.objects.
        super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
        _M_impl.super__Vector_impl_data._M_start + 1);
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start[1].super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x401c000000000000;
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start[2].super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x401c000000000000;
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start[2].super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x401c000000000000;
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start[1].super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)&PTR_value_0012e680;
  light.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<diffuse_light,std::allocator<diffuse_light>,std::shared_ptr<constant_texture>>
            (&light.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (diffuse_light **)&light,(allocator<diffuse_light> *)&center1,
             (shared_ptr<constant_texture> *)&boxes2);
  if (boxes2.objects.
      super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               boxes2.objects.
               super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
  }
  center1.e[0] = (double)CONCAT44(center1.e[0]._4_4_,0x7b);
  center2.e[0] = (double)CONCAT44(center2.e[0]._4_4_,0x1a7);
  local_288.e[0] = (double)CONCAT44(local_288.e[0]._4_4_,0x93);
  moving_sphere_material.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       CONCAT44(moving_sphere_material.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr._4_4_,0x19c);
  boundary.super___shared_ptr<sphere,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       CONCAT44(boundary.super___shared_ptr<sphere,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_,0x22a);
  boxes2.super_hittable._vptr_hittable = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<xz_rect,std::allocator<xz_rect>,int,int,int,int,int,std::shared_ptr<diffuse_light>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&boxes2.objects,(xz_rect **)&boxes2,
             (allocator<xz_rect> *)&emat,(int *)&center1,(int *)&center2,(int *)&local_288,
             (int *)&moving_sphere_material,(int *)&boundary,&light);
  local_60.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)boxes2.super_hittable._vptr_hittable;
  local_60.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       boxes2.objects.
       super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  boxes2.super_hittable._vptr_hittable = (_func_int **)0x0;
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (pvVar1,&local_60);
  if (local_60.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (boxes2.objects.
      super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               boxes2.objects.
               super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
  }
  center1.e[0] = 400.0;
  center1.e[1] = 400.0;
  center1.e[2] = 200.0;
  center2.e[0] = 430.0;
  center2.e[1] = 400.0;
  center2.e[2] = 200.0;
  boxes2.super_hittable._vptr_hittable = (_func_int **)0x0;
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)operator_new(0x30);
  ((boxes2.objects.
    super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
    _M_impl.super__Vector_impl_data._M_start)->
  super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x100000001;
  ((boxes2.objects.
    super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
    _M_impl.super__Vector_impl_data._M_start)->
  super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)&PTR___Sp_counted_ptr_inplace_0012e630;
  boxes2.super_hittable._vptr_hittable =
       (_func_int **)
       (boxes2.objects.
        super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
        _M_impl.super__Vector_impl_data._M_start + 1);
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start[1].super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3fe6666666666666;
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start[2].super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x3fd3333333333333;
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start[2].super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3fb999999999999a;
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start[1].super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)&PTR_value_0012e680;
  moving_sphere_material.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<lambertian,std::allocator<lambertian>,std::shared_ptr<constant_texture>>
            (&moving_sphere_material.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(lambertian **)&moving_sphere_material,(allocator<lambertian> *)&local_288
             ,(shared_ptr<constant_texture> *)&boxes2);
  if (boxes2.objects.
      super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               boxes2.objects.
               super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
  }
  local_288.e[0] = (double)((ulong)local_288.e[0] & 0xffffffff00000000);
  boundary.super___shared_ptr<sphere,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       CONCAT44(boundary.super___shared_ptr<sphere,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_,1);
  emat.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       CONCAT44(emat.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_,0x32);
  boxes2.super_hittable._vptr_hittable = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<moving_sphere,std::allocator<moving_sphere>,vec3&,vec3&,int,int,int,std::shared_ptr<lambertian>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&boxes2.objects,(moving_sphere **)&boxes2
             ,(allocator<moving_sphere> *)&pertext,&center1,&center2,(int *)&local_288,
             (int *)&boundary,(int *)&emat,&moving_sphere_material);
  local_70.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)boxes2.super_hittable._vptr_hittable;
  local_70.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       boxes2.objects.
       super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  boxes2.super_hittable._vptr_hittable = (_func_int **)0x0;
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (pvVar1,&local_70);
  if (local_70.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (boxes2.objects.
      super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               boxes2.objects.
               super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
  }
  boxes2.super_hittable._vptr_hittable = (_func_int **)0x4070400000000000;
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x4062c00000000000;
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x4046800000000000;
  emat.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       CONCAT44(emat.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_,0x32);
  boundary.super___shared_ptr<sphere,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  boundary.super___shared_ptr<sphere,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  (boundary.super___shared_ptr<sphere,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count
       = 1;
  (boundary.super___shared_ptr<sphere,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_weak_count
       = 1;
  (boundary.super___shared_ptr<sphere,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0012e918;
  boundary.super___shared_ptr<sphere,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (boundary.super___shared_ptr<sphere,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 1);
  boundary.super___shared_ptr<sphere,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _vptr__Sp_counted_base = (_func_int **)&PTR_emitted_0012e968;
  boundary.super___shared_ptr<sphere,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1]._M_use_count
       = 0;
  boundary.super___shared_ptr<sphere,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1]._M_weak_count
       = 0x3ff80000;
  local_288.e[0] = 0.0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<sphere,std::allocator<sphere>,vec3,int,std::shared_ptr<dielectric>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_288.e + 1),(sphere **)&local_288,
             (allocator<sphere> *)&pertext,(vec3 *)&boxes2,(int *)&emat,
             (shared_ptr<dielectric> *)&boundary);
  local_80.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_288.e[0];
  local_80.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288.e[1];
  local_288.e[0] = 0.0;
  local_288.e[1] = 0.0;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (pvVar1,&local_80);
  if (local_80.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288.e[1] !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288.e[1]);
  }
  if (boundary.super___shared_ptr<sphere,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (boundary.super___shared_ptr<sphere,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  boxes2.super_hittable._vptr_hittable = (_func_int **)0x0;
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x4062c00000000000;
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x4062200000000000;
  emat.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       CONCAT44(emat.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_,0x32);
  boundary.super___shared_ptr<sphere,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  boundary.super___shared_ptr<sphere,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
  (boundary.super___shared_ptr<sphere,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count
       = 1;
  (boundary.super___shared_ptr<sphere,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_weak_count
       = 1;
  (boundary.super___shared_ptr<sphere,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0012e880;
  boundary.super___shared_ptr<sphere,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (boundary.super___shared_ptr<sphere,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 1);
  boundary.super___shared_ptr<sphere,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _vptr__Sp_counted_base = (_func_int **)&PTR_emitted_0012e8d0;
  boundary.super___shared_ptr<sphere,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1]._M_use_count
       = -0x66666666;
  boundary.super___shared_ptr<sphere,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1]._M_weak_count
       = 0x3fe99999;
  boundary.super___shared_ptr<sphere,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
  _vptr__Sp_counted_base = (_func_int **)0x3fe999999999999a;
  boundary.super___shared_ptr<sphere,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2]._M_use_count
       = -0x33333333;
  boundary.super___shared_ptr<sphere,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2]._M_weak_count
       = 0x3feccccc;
  boundary.super___shared_ptr<sphere,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[3].
  _vptr__Sp_counted_base = (_func_int **)0x3ff0000000000000;
  local_288.e[0] = 0.0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<sphere,std::allocator<sphere>,vec3,int,std::shared_ptr<metal>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_288.e + 1),(sphere **)&local_288,
             (allocator<sphere> *)&pertext,(vec3 *)&boxes2,(int *)&emat,
             (shared_ptr<metal> *)&boundary);
  local_90.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_288.e[0];
  local_90.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288.e[1];
  local_288.e[0] = 0.0;
  local_288.e[1] = 0.0;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (local_208,&local_90);
  if (local_90.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_90.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288.e[1] !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288.e[1]);
  }
  if (boundary.super___shared_ptr<sphere,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (boundary.super___shared_ptr<sphere,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  boxes2.super_hittable._vptr_hittable = (_func_int **)0x4076800000000000;
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x4062c00000000000;
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x4062200000000000;
  emat.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       CONCAT44(emat.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_,0x46);
  local_288.e[0] = 0.0;
  local_288.e[1] = (double)operator_new(0x20);
  pvVar1 = local_208;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288.e[1])->_M_use_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288.e[1])->_M_weak_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288.e[1])->_vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_0012e918;
  local_288.e[0] = (double)((long)local_288.e[1] + 0x10);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_288.e[1] + 0x10))->
  _vptr__Sp_counted_base = (_func_int **)&PTR_emitted_0012e968;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_288.e[1] + 0x10))->_M_use_count = 0;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_288.e[1] + 0x10))->_M_weak_count =
       0x3ff80000;
  boundary.super___shared_ptr<sphere,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<sphere,std::allocator<sphere>,vec3,int,std::shared_ptr<dielectric>>
            (&boundary.super___shared_ptr<sphere,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (sphere **)&boundary,(allocator<sphere> *)&pertext,(vec3 *)&boxes2,(int *)&emat,
             (shared_ptr<dielectric> *)&local_288);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288.e[1] !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288.e[1]);
  }
  local_168.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &(boundary.super___shared_ptr<sphere,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_hittable;
  local_168.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       boundary.super___shared_ptr<sphere,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (boundary.super___shared_ptr<sphere,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (boundary.super___shared_ptr<sphere,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (boundary.super___shared_ptr<sphere,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (boundary.super___shared_ptr<sphere,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (boundary.super___shared_ptr<sphere,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
    }
  }
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (pvVar1,&local_168);
  if (local_168.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_168.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  emat.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x3fc999999999999a;
  local_288.e[0] = 0.0;
  local_288.e[1] = (double)operator_new(0x30);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288.e[1])->_M_use_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288.e[1])->_M_weak_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288.e[1])->_vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_0012e630;
  local_288.e[0] = (double)((long)local_288.e[1] + 0x10);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_288.e[1] + 0x10))->_M_use_count =
       -0x66666666;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_288.e[1] + 0x10))->_M_weak_count =
       0x3fc99999;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_288.e[1] + 0x20))->
  _vptr__Sp_counted_base = (_func_int **)0x3fd999999999999a;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_288.e[1] + 0x20))->_M_use_count =
       -0x33333333;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_288.e[1] + 0x20))->_M_weak_count =
       0x3feccccc;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_288.e[1] + 0x10))->
  _vptr__Sp_counted_base = (_func_int **)&PTR_value_0012e680;
  boxes2.super_hittable._vptr_hittable = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<constant_medium,std::allocator<constant_medium>,std::shared_ptr<sphere>&,double,std::shared_ptr<constant_texture>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&boxes2.objects,
             (constant_medium **)&boxes2,(allocator<constant_medium> *)&pertext,&boundary,
             (double *)&emat,(shared_ptr<constant_texture> *)&local_288);
  local_a0.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)boxes2.super_hittable._vptr_hittable;
  local_a0.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       boxes2.objects.
       super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  boxes2.super_hittable._vptr_hittable = (_func_int **)0x0;
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (pvVar1,&local_a0);
  if (local_a0.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a0.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (boxes2.objects.
      super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               boxes2.objects.
               super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288.e[1] !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288.e[1]);
  }
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  boxes2.super_hittable._vptr_hittable = (_func_int **)0x0;
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  pertext.super___shared_ptr<noise_texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       CONCAT44(pertext.super___shared_ptr<noise_texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_,
                5000);
  emat.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  emat.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  (emat.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count
       = 1;
  (emat.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_weak_count
       = 1;
  (emat.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0012e918;
  emat.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (emat.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 1);
  emat.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _vptr__Sp_counted_base = (_func_int **)&PTR_emitted_0012e968;
  emat.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1]._M_use_count
       = 0;
  emat.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1]._M_weak_count
       = 0x3ff80000;
  local_288.e[0] = 0.0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<sphere,std::allocator<sphere>,vec3,int,std::shared_ptr<dielectric>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_288.e + 1),(sphere **)&local_288,
             (allocator<sphere> *)&white,(vec3 *)&boxes2,(int *)&pertext,
             (shared_ptr<dielectric> *)&emat);
  this = boundary.super___shared_ptr<sphere,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  boundary.super___shared_ptr<sphere,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288.e[1];
  boundary.super___shared_ptr<sphere,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_288.e[0];
  local_288.e[0] = 0.0;
  local_288.e[1] = 0.0;
  if (this._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288.e[1] !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288.e[1]);
  }
  if (emat.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (emat.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  emat.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x3f1a36e2eb1c432d;
  local_288.e[0] = 0.0;
  local_288.e[1] = (double)operator_new(0x30);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288.e[1])->_M_use_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288.e[1])->_M_weak_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288.e[1])->_vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_0012e630;
  local_288.e[0] = (double)((long)local_288.e[1] + 0x10);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_288.e[1] + 0x10))->_M_use_count = 0;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_288.e[1] + 0x10))->_M_weak_count =
       0x3ff00000;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_288.e[1] + 0x20))->
  _vptr__Sp_counted_base = (_func_int **)0x3ff0000000000000;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_288.e[1] + 0x20))->_M_use_count = 0;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_288.e[1] + 0x20))->_M_weak_count =
       0x3ff00000;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_288.e[1] + 0x10))->
  _vptr__Sp_counted_base = (_func_int **)&PTR_value_0012e680;
  boxes2.super_hittable._vptr_hittable = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<constant_medium,std::allocator<constant_medium>,std::shared_ptr<sphere>&,double,std::shared_ptr<constant_texture>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&boxes2.objects,
             (constant_medium **)&boxes2,(allocator<constant_medium> *)&pertext,&boundary,
             (double *)&emat,(shared_ptr<constant_texture> *)&local_288);
  local_b0.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)boxes2.super_hittable._vptr_hittable;
  local_b0.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       boxes2.objects.
       super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  boxes2.super_hittable._vptr_hittable = (_func_int **)0x0;
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (pvVar1,&local_b0);
  if (local_b0.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b0.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (boxes2.objects.
      super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               boxes2.objects.
               super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288.e[1] !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288.e[1]);
  }
  p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)stbi_load("earthmap.jpg",&nx,&ny,&nn,0);
  boxes2.super_hittable._vptr_hittable = (_func_int **)0x0;
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)operator_new(0x28);
  ((boxes2.objects.
    super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
    _M_impl.super__Vector_impl_data._M_start)->
  super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x100000001;
  ((boxes2.objects.
    super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
    _M_impl.super__Vector_impl_data._M_start)->
  super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)&PTR___Sp_counted_ptr_inplace_0012ea30;
  boxes2.super_hittable._vptr_hittable =
       (_func_int **)
       (boxes2.objects.
        super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
        _M_impl.super__Vector_impl_data._M_start + 1);
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start[1].super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)&PTR_value_0012ea80;
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start[1].super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var7;
  *(int *)&boxes2.objects.
           super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
           ._M_impl.super__Vector_impl_data._M_start[2].
           super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr = nx;
  *(int *)((long)&boxes2.objects.
                  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[2].
                  super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4) = ny;
  emat.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<lambertian,std::allocator<lambertian>,std::shared_ptr<image_texture>>
            (&emat.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (lambertian **)&emat,(allocator<lambertian> *)&local_288,
             (shared_ptr<image_texture> *)&boxes2);
  if (boxes2.objects.
      super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               boxes2.objects.
               super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
  }
  boxes2.super_hittable._vptr_hittable = (_func_int **)0x4079000000000000;
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x4069000000000000;
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x4079000000000000;
  pertext.super___shared_ptr<noise_texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       CONCAT44(pertext.super___shared_ptr<noise_texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_,
                100);
  local_288.e[0] = 0.0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<sphere,std::allocator<sphere>,vec3,int,std::shared_ptr<lambertian>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_288.e + 1),(sphere **)&local_288,
             (allocator<sphere> *)&white,(vec3 *)&boxes2,(int *)&pertext,&emat);
  local_c0.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_288.e[0];
  local_c0.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288.e[1];
  local_288.e[0] = 0.0;
  local_288.e[1] = 0.0;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (pvVar1,&local_c0);
  if (local_c0.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288.e[1] !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288.e[1]);
  }
  boxes2.super_hittable._vptr_hittable = (_func_int **)0x3fb999999999999a;
  pertext.super___shared_ptr<noise_texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<noise_texture,std::allocator<noise_texture>,double>
            (&pertext.super___shared_ptr<noise_texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (noise_texture **)&pertext,(allocator<noise_texture> *)&local_288,(double *)&boxes2);
  boxes2.super_hittable._vptr_hittable = (_func_int **)0x406b800000000000;
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x4071800000000000;
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x4072c00000000000;
  local_220 = (sphere *)CONCAT44(local_220._4_4_,0x50);
  white.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<lambertian,std::allocator<lambertian>,std::shared_ptr<noise_texture>&>
            (&white.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (lambertian **)&white,(allocator<lambertian> *)&local_1e0,&pertext);
  local_288.e[0] = 0.0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<sphere,std::allocator<sphere>,vec3,int,std::shared_ptr<lambertian>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_288.e + 1),(sphere **)&local_288,
             (allocator<sphere> *)&local_1e0,(vec3 *)&boxes2,(int *)&local_220,&white);
  local_d0.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_288.e[0];
  local_d0.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288.e[1];
  local_288.e[0] = 0.0;
  local_288.e[1] = 0.0;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (pvVar1,&local_d0);
  if (local_d0.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288.e[1] !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288.e[1]);
  }
  if (white.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (white.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  boxes2.super_hittable._vptr_hittable = (_func_int **)&PTR_hit_0012e0b8;
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  boxes2.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_288.e[0] = 0.0;
  local_288.e[1] = (double)operator_new(0x30);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288.e[1])->_M_use_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288.e[1])->_M_weak_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288.e[1])->_vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_0012e630;
  local_288.e[0] = (double)((long)local_288.e[1] + 0x10);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_288.e[1] + 0x10))->_M_use_count =
       -0xa3d70a4;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_288.e[1] + 0x10))->_M_weak_count =
       0x3fe75c28;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_288.e[1] + 0x20))->
  _vptr__Sp_counted_base = (_func_int **)0x3fe75c28f5c28f5c;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_288.e[1] + 0x20))->_M_use_count =
       -0xa3d70a4;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_288.e[1] + 0x20))->_M_weak_count =
       0x3fe75c28;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_288.e[1] + 0x10))->
  _vptr__Sp_counted_base = (_func_int **)&PTR_value_0012e680;
  white.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<lambertian,std::allocator<lambertian>,std::shared_ptr<constant_texture>>
            (&white.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (lambertian **)&white,(allocator<lambertian> *)&local_220,
             (shared_ptr<constant_texture> *)&local_288);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288.e[1] !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288.e[1]);
  }
  iVar5 = 1000;
  do {
    iVar8 = rand();
    iVar4 = rand();
    iVar6 = rand();
    local_288.e[2] = (double)iVar6 * 4.656612873077393e-10 * 165.0 + 0.0;
    local_1e0.super___shared_ptr<rotate_y,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         CONCAT44(local_1e0.super___shared_ptr<rotate_y,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_,10
                 );
    local_220 = (sphere *)0x0;
    local_288.e[0] = (double)((double)iVar8 * 4.656612873077393e-10 * 165.0 + 0.0);
    local_288.e[1] = (double)((double)iVar4 * 4.656612873077393e-10 * 165.0 + 0.0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<sphere,std::allocator<sphere>,vec3,int,std::shared_ptr<lambertian>&>
              (&_Stack_218,&local_220,(allocator<sphere> *)&local_178,&local_288,(int *)&local_1e0,
               &white);
    local_138.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &local_220->super_hittable;
    local_138.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Stack_218._M_pi;
    local_220 = (sphere *)0x0;
    _Stack_218._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
              (&boxes2.objects,&local_138);
    if (local_138.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_138.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (_Stack_218._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_218._M_pi);
    }
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  local_38 = 0.0;
  local_40 = 1.0;
  local_178.super___shared_ptr<bvh_node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<bvh_node,std::allocator<bvh_node>,hittable_list&,double,double>
            (&local_178.super___shared_ptr<bvh_node,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (bvh_node **)&local_178,(allocator<bvh_node> *)&local_288,&boxes2,&local_38,&local_40);
  pvVar1 = local_208;
  local_108 = 0xf;
  local_1e0.super___shared_ptr<rotate_y,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<rotate_y,std::allocator<rotate_y>,std::shared_ptr<bvh_node>,int>
            (&local_1e0.super___shared_ptr<rotate_y,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (rotate_y **)&local_1e0,(allocator<rotate_y> *)&local_288,&local_178,&local_108);
  local_288.e[0] = -100.0;
  local_288.e[1] = 270.0;
  local_288.e[2] = 395.0;
  local_220 = (sphere *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<translate,std::allocator<translate>,std::shared_ptr<rotate_y>,vec3>
            (&_Stack_218,(translate **)&local_220,(allocator<translate> *)&local_209,&local_1e0,
             &local_288);
  local_e0.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_220->super_hittable;
  local_e0.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_218._M_pi;
  local_220 = (sphere *)0x0;
  _Stack_218._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (pvVar1,&local_e0);
  if (local_e0.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e0.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (_Stack_218._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_218._M_pi);
  }
  if (local_1e0.super___shared_ptr<rotate_y,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1e0.super___shared_ptr<rotate_y,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  if (local_178.super___shared_ptr<bvh_node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_178.super___shared_ptr<bvh_node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  if (white.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (white.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  boxes2.super_hittable._vptr_hittable = (_func_int **)&PTR_hit_0012e0b8;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::~vector
            (&boxes2.objects);
  if (pertext.super___shared_ptr<noise_texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (pertext.super___shared_ptr<noise_texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (emat.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (emat.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (boundary.super___shared_ptr<sphere,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (boundary.super___shared_ptr<sphere,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (moving_sphere_material.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (moving_sphere_material.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (light.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (light.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
  }
  if (ground.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (ground.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  boxes1.super_hittable._vptr_hittable = (_func_int **)&PTR_hit_0012e0b8;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::~vector
            (&boxes1.objects);
  return in_RDI;
}

Assistant:

hittable_list final_scene() {
    hittable_list boxes1;
    auto ground =
            make_shared<lambertian>(make_shared<constant_texture>(vec3(0.48, 0.83, 0.53)));

    const int boxes_per_side = 20;
    for (int i = 0; i < boxes_per_side; i++) {
        for (int j = 0; j < boxes_per_side; j++) {
            auto w = 100.0;
            auto x0 = -1000.0 + i*w;
            auto z0 = -1000.0 + j*w;
            auto y0 = 0.0;
            auto x1 = x0 + w;
            auto y1 = random_double(1,101);
            auto z1 = z0 + w;

            boxes1.add(make_shared<box>(vec3(x0,y0,z0), vec3(x1,y1,z1), ground));
        }
    }

    hittable_list objects;

    objects.add(make_shared<bvh_node>(boxes1, 0, 1));

    auto light = make_shared<diffuse_light>(make_shared<constant_texture>(vec3(7, 7, 7)));
    objects.add(make_shared<xz_rect>(123, 423, 147, 412, 554, light));

    auto center1 = vec3(400, 400, 200);
    auto center2 = center1 + vec3(30,0,0);
    auto moving_sphere_material =
            make_shared<lambertian>(make_shared<constant_texture>(vec3(0.7, 0.3, 0.1)));
    objects.add(make_shared<moving_sphere>(center1, center2, 0, 1, 50, moving_sphere_material));

    objects.add(make_shared<sphere>(vec3(260, 150, 45), 50, make_shared<dielectric>(1.5)));
    objects.add(make_shared<sphere>(
            vec3(0, 150, 145), 50, make_shared<metal>(vec3(0.8, 0.8, 0.9), 10.0)
    ));

    auto boundary = make_shared<sphere>(vec3(360, 150, 145), 70, make_shared<dielectric>(1.5));
    objects.add(boundary);
    objects.add(make_shared<constant_medium>(
            boundary, 0.2, make_shared<constant_texture>(vec3(0.2, 0.4, 0.9))
    ));
    boundary = make_shared<sphere>(vec3(0, 0, 0), 5000, make_shared<dielectric>(1.5));
    objects.add(make_shared<constant_medium>(
            boundary, .0001, make_shared<constant_texture>(vec3(1,1,1))));

    int nx, ny, nn;
    auto tex_data = stbi_load("earthmap.jpg", &nx, &ny, &nn, 0);
    auto emat = make_shared<lambertian>(make_shared<image_texture>(tex_data, nx, ny));
    objects.add(make_shared<sphere>(vec3(400,200, 400), 100, emat));
    auto pertext = make_shared<noise_texture>(0.1);
    objects.add(make_shared<sphere>(vec3(220,280, 300), 80, make_shared<lambertian>(pertext)));

    hittable_list boxes2;
    auto white = make_shared<lambertian>(make_shared<constant_texture>(vec3(0.73, 0.73, 0.73)));
    int ns = 1000;
    for (int j = 0; j < ns; j++) {
        boxes2.add(make_shared<sphere>(vec3::random(0,165), 10, white));
    }

    objects.add(make_shared<translate>(
            make_shared<rotate_y>(
                    make_shared<bvh_node>(boxes2, 0.0, 1.0), 15),
            vec3(-100,270,395)
                )
    );

    return objects;
}